

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O2

_patch * get_patch_data(unsigned_short patchid)

{
  ushort uVar1;
  uint uVar2;
  _patch *p_Var3;
  
  uVar2 = (uint)patchid;
  while( true ) {
    FCriticalSection::Enter(&patch_lock);
    p_Var3 = patch[uVar2 & 0x7f];
    if (p_Var3 == (_patch *)0x0) break;
    for (; uVar1 = (ushort)uVar2, p_Var3 != (_patch *)0x0; p_Var3 = p_Var3->next) {
      if (p_Var3->patchid == uVar1) goto LAB_0036272b;
    }
    FCriticalSection::Leave(&patch_lock);
    uVar2 = patchid & 0xff;
    if (uVar1 < 0x100) {
      return (_patch *)0x0;
    }
  }
  p_Var3 = (_patch *)0x0;
LAB_0036272b:
  FCriticalSection::Leave(&patch_lock);
  return p_Var3;
}

Assistant:

static struct _patch *
get_patch_data(unsigned short patchid) {
	struct _patch *search_patch;

	patch_lock.Enter();

	search_patch = patch[patchid & 0x007F];

	if (search_patch == NULL) {
		patch_lock.Leave();
		return NULL;
	}

	while (search_patch) {
		if (search_patch->patchid == patchid) {
			patch_lock.Leave();
			return search_patch;
		}
		search_patch = search_patch->next;
	}
	if ((patchid >> 8) != 0) {
		patch_lock.Leave();
		return (get_patch_data(patchid & 0x00FF));
	}
	patch_lock.Leave();
	return NULL;
}